

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsTagAllocate(FmsTag tag,FmsIntType stored_tag_type,void **ent_tags,FmsInt *num_ents)

{
  FmsComponent pFVar1;
  FmsInt FVar2;
  void *pvVar3;
  int iVar4;
  
  if (tag == (FmsTag)0x0) {
    iVar4 = 1;
  }
  else if (stored_tag_type < FMS_NUM_INT_TYPES) {
    if (tag->tag_type == FMS_NUM_INT_TYPES || tag->tag_type == stored_tag_type) {
      if (ent_tags == (void **)0x0) {
        iVar4 = 4;
      }
      else {
        pFVar1 = tag->comp;
        if (pFVar1 == (FmsComponent)0x0) {
          iVar4 = 5;
        }
        else {
          free(tag->tags);
          tag->tags = (void *)0x0;
          FVar2 = pFVar1->num_main_entities;
          if (FVar2 == 0) {
            pvVar3 = (void *)0x0;
          }
          else {
            pvVar3 = malloc(FmsIntTypeSize[stored_tag_type] * FVar2);
            tag->tags = pvVar3;
            if (pvVar3 == (void *)0x0) {
              return 6;
            }
          }
          tag->tag_type = stored_tag_type;
          *ent_tags = pvVar3;
          iVar4 = 0;
          if (num_ents != (FmsInt *)0x0) {
            *num_ents = FVar2;
            iVar4 = 0;
          }
        }
      }
    }
    else {
      iVar4 = 3;
    }
  }
  else {
    iVar4 = 2;
  }
  return iVar4;
}

Assistant:

int FmsTagAllocate(FmsTag tag, FmsIntType stored_tag_type, void **ent_tags,
                   FmsInt *num_ents) {
  if (!tag) { E_RETURN(1); }
  if (stored_tag_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (tag->tag_type != FMS_NUM_INT_TYPES && tag->tag_type != stored_tag_type) {
    E_RETURN(3);
  }
  if (ent_tags == NULL) { E_RETURN(4); }
  FmsComponent comp = tag->comp;
  if (!comp) { E_RETURN(5); }
  free(tag->tags);
  tag->tags = NULL;
  FmsInt num_entities = comp->num_main_entities;
  if (num_entities != 0) {
    tag->tags = malloc(num_entities*FmsIntTypeSize[stored_tag_type]);
    if (tag->tags == NULL) { E_RETURN(6); }
  }
  tag->tag_type = stored_tag_type;
  *ent_tags = tag->tags;
  if (num_ents != NULL) { *num_ents = num_entities; }
  return 0;
}